

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::get_thread_name(char *buffer,unsigned_long_long length,bool right_align_hext_id)

{
  char *pcVar1;
  char *pcVar2;
  pthread_t pVar3;
  uint64_t thread_id;
  char *name;
  pthread_t thread;
  Text user_msg;
  Text fail_info;
  Text local_40;
  Text str_right;
  Text str_left;
  unsigned_long_long uStack_28;
  uint val_right;
  unsigned_long_long val_left;
  unsigned_long_long uStack_18;
  bool right_align_hext_id_local;
  unsigned_long_long length_local;
  char *buffer_local;
  
  str_left._str._4_4_ = 0;
  uStack_28 = length;
  val_left._7_1_ = right_align_hext_id;
  uStack_18 = length;
  length_local = (unsigned_long_long)buffer;
  if (length == 0) {
    format_value<unsigned_long_long>((loguru *)&str_right,&stack0xffffffffffffffd8);
    format_value<unsigned_int>((loguru *)&local_40,(uint *)((long)&str_left._str + 4));
    pcVar1 = Text::c_str(&str_right);
    pcVar2 = Text::c_str(&local_40);
    textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","length","!=","0u",pcVar1,
               "!=",pcVar2);
    textprintf((char *)&thread,"Zero length buffer in get_thread_name");
    pcVar1 = Text::c_str(&user_msg);
    pcVar2 = Text::c_str((Text *)&thread);
    log_and_abort(0,pcVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                  ,0x3aa,"%s",pcVar2);
  }
  if (buffer != (char *)0x0) {
    pVar3 = pthread_self();
    pcVar1 = get_thread_name_ptls();
    if (pcVar1 == (char *)0x0) {
      *(undefined1 *)length_local = 0;
    }
    else {
      snprintf((char *)length_local,uStack_18,"%s",pcVar1);
    }
    if (*(char *)length_local == '\0') {
      if ((val_left._7_1_ & 1) == 0) {
        snprintf((char *)length_local,uStack_18,"%X",pVar3 & 0xffffffff);
      }
      else {
        snprintf((char *)length_local,uStack_18,"%*X",(ulong)((int)uStack_18 - 1),pVar3 & 0xffffffff
                );
      }
    }
    return;
  }
  log_and_abort(0,"CHECK FAILED:  buffer != nullptr  ",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x3ab,"nullptr in get_thread_name");
}

Assistant:

void get_thread_name(char* buffer, unsigned long long length, bool right_align_hext_id)
	{
#ifdef _WIN32
		(void)right_align_hext_id;
#endif
		CHECK_NE_F(length, 0u, "Zero length buffer in get_thread_name");
		CHECK_NOTNULL_F(buffer, "nullptr in get_thread_name");
#if LOGURU_PTHREADS
		auto thread = pthread_self();
		#if LOGURU_PTLS_NAMES
			if (const char* name = get_thread_name_ptls()) {
				snprintf(buffer, length, "%s", name);
			} else {
				buffer[0] = 0;
			}
		#elif defined(__APPLE__) || defined(__linux__)
			pthread_getname_np(thread, buffer, length);
		#else
			buffer[0] = 0;
		#endif

		if (buffer[0] == 0) {
			#ifdef __APPLE__
				uint64_t thread_id;
				pthread_threadid_np(thread, &thread_id);
			#elif defined(__FreeBSD__)
				long thread_id;
				(void)thr_self(&thread_id);
			#elif defined(__OpenBSD__)
				unsigned thread_id = -1;
			#else
				uint64_t thread_id = thread;
			#endif
			if (right_align_hext_id) {
				snprintf(buffer, length, "%*X", static_cast<int>(length - 1), static_cast<unsigned>(thread_id));
			} else {
				snprintf(buffer, length, "%X", static_cast<unsigned>(thread_id));
			}
		}
#elif LOGURU_WINTHREADS
		if (const char* name = get_thread_name_win32()) {
			snprintf(buffer, (size_t)length, "%s", name);
		} else {
			buffer[0] = 0;
		}
#else // !LOGURU_WINTHREADS && !LOGURU_WINTHREADS
		buffer[0] = 0;
#endif

	}